

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
ElementsAreMatcherImpl<const_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_&>
::DescribeNegationTo
          (ElementsAreMatcherImpl<const_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_&>
           *this,ostream *os)

{
  ostream *poVar1;
  ulong uVar2;
  pointer *__ptr;
  ulong uVar3;
  long lVar4;
  undefined1 local_58 [16];
  pointer local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((this->matchers_).
      super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->matchers_).
      super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"doesn\'t have ",0xd);
    Elements((ElementsAreMatcherImpl<const_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_&>
              *)local_58,
             ((long)(this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    Message::GetString_abi_cxx11_((string *)(local_58 + 8),(Message *)local_58);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(char *)local_58._8_8_,(long)local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._8_8_ != &local_40) {
      operator_delete((void *)local_58._8_8_,(ulong)(local_40._M_allocated_capacity + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", or\n",5);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_58._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_58._0_8_ + 8))();
    }
    if ((this->matchers_).
        super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->matchers_).
        super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"element #",9);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
        ::DescribeNegationTo
                  ((MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
                    *)((long)&(((this->matchers_).
                                super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
                              ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                      lVar4),os);
        uVar3 = uVar3 + 1;
        uVar2 = ((long)(this->matchers_).
                       super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->matchers_).
                       super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar3 < uVar2) {
          std::__ostream_insert<char,std::char_traits<char>>(os,", or\n",5);
          uVar2 = ((long)(this->matchers_).
                         super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->matchers_).
                         super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        }
        lVar4 = lVar4 + 0x18;
      } while (uVar3 != uVar2);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"isn\'t empty",0xb);
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "isn't empty";
      return;
    }

    *os << "doesn't have " << Elements(count()) << ", or\n";
    for (size_t i = 0; i != count(); ++i) {
      *os << "element #" << i << " ";
      matchers_[i].DescribeNegationTo(os);
      if (i + 1 < count()) {
        *os << ", or\n";
      }
    }
  }